

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void call_init_write(qpdf_data qpdf)

{
  __shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<QPDFWriter,QPDF&,char_const*&>
            ((QPDF *)&local_20,
             (char **)(qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

static void
call_init_write(qpdf_data qpdf)
{
    qpdf->qpdf_writer = std::make_shared<QPDFWriter>(*(qpdf->qpdf), qpdf->filename);
}